

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_PlotFileUtil.cpp
# Opt level: O1

void amrex::WriteSingleLevelPlotfile
               (string *plotfilename,MultiFab *mf,
               Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *varnames,Geometry *geom,Real time,int level_step,string *versionName,
               string *levelPrefix,string *mfPrefix,
               Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *extra_dirs)

{
  Geometry *__cur;
  pointer ppMVar1;
  int __tmp_1;
  MultiFab *__tmp;
  pointer pGVar2;
  Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> geomarr;
  Vector<int,_std::allocator<int>_> level_steps;
  Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> mfarr;
  Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> ref_ratio;
  
  mfarr.super_vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>.
  super__Vector_base<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  mfarr.super_vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>.
  super__Vector_base<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  mfarr.super_vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>.
  super__Vector_base<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ppMVar1 = (pointer)operator_new(8);
  mfarr.super_vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>.
  super__Vector_base<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>._M_impl.
  super__Vector_impl_data._M_finish = ppMVar1 + 1;
  *ppMVar1 = mf;
  geomarr.super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
  super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  geomarr.super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
  super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  geomarr.super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
  super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  mfarr.super_vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>.
  super__Vector_base<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>._M_impl.
  super__Vector_impl_data._M_start = ppMVar1;
  mfarr.super_vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>.
  super__Vector_base<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       mfarr.super_vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>.
       super__Vector_base<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>._M_impl
       .super__Vector_impl_data._M_finish;
  geomarr.super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
  super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)operator_new(200);
  pGVar2 = geomarr.super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
           super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
           super__Vector_impl_data._M_start + 1;
  geomarr.super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
  super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
  super__Vector_impl_data._M_finish =
       geomarr.super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
       super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
       super__Vector_impl_data._M_start;
  geomarr.super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
  super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = pGVar2;
  memcpy(geomarr.super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
         super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
         super__Vector_impl_data._M_start,geom,200);
  level_steps.super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  level_steps.super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  level_steps.super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  geomarr.super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
  super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
  super__Vector_impl_data._M_finish = pGVar2;
  level_steps.super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)operator_new(4);
  level_steps.super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       level_steps.super_vector<int,_std::allocator<int>_>.
       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start + 1;
  *level_steps.super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>
   ._M_impl.super__Vector_impl_data._M_start = level_step;
  ref_ratio.super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
  super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  ref_ratio.super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
  super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  ref_ratio.super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
  super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  level_steps.super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       level_steps.super_vector<int,_std::allocator<int>_>.
       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish;
  WriteMultiLevelPlotfile
            (plotfilename,1,&mfarr,varnames,&geomarr,time,&level_steps,&ref_ratio,versionName,
             levelPrefix,mfPrefix,extra_dirs);
  if (ref_ratio.super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
      super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(ref_ratio.super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                    super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)ref_ratio.super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                          super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)ref_ratio.super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                          super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (level_steps.super_vector<int,_std::allocator<int>_>.
      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start !=
      (pointer)0x0) {
    operator_delete(level_steps.super_vector<int,_std::allocator<int>_>.
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_start,(long)level_steps.super_vector<int,_std::allocator<int>_>.
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_end_of_storage -
                             (long)level_steps.super_vector<int,_std::allocator<int>_>.
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start);
  }
  if (geomarr.super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
      super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(geomarr.super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                    super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)geomarr.super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                          super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)geomarr.super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                          super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  operator_delete(ppMVar1,8);
  return;
}

Assistant:

void
WriteSingleLevelPlotfile (const std::string& plotfilename,
                          const MultiFab& mf, const Vector<std::string>& varnames,
                          const Geometry& geom, Real time, int level_step,
                          const std::string &versionName,
                          const std::string &levelPrefix,
                          const std::string &mfPrefix,
                          const Vector<std::string>& extra_dirs)
{
    Vector<const MultiFab*> mfarr(1,&mf);
    Vector<Geometry> geomarr(1,geom);
    Vector<int> level_steps(1,level_step);
    Vector<IntVect> ref_ratio;

    WriteMultiLevelPlotfile(plotfilename, 1, mfarr, varnames, geomarr, time,
                            level_steps, ref_ratio, versionName, levelPrefix, mfPrefix, extra_dirs);
}